

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

void vkt::shaderexecutor::anon_unknown_0::VertexShaderExecutor::generateSources
               (ShaderSpec *shaderSpec,SourceCollections *programCollection)

{
  size_t sVar1;
  ProgramSources *pPVar2;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  string local_1a0;
  ShaderSource local_180;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  ShaderSource local_c0;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  FragmentOutputLayout outputLayout;
  SourceCollections *programCollection_local;
  ShaderSpec *shaderSpec_local;
  
  outputLayout.locationMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)programCollection;
  computeFragmentOutputLayout((FragmentOutputLayout *)local_60,&shaderSpec->outputs);
  sVar1 = outputLayout.locationMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"vert",&local_81);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)sVar1,&local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"a_",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"vtx_out_",&local_129);
  generateVertexShader(&local_e0,shaderSpec,&local_100,&local_128);
  glu::VertexSource::VertexSource((VertexSource *)&local_c0,&local_e0);
  glu::ProgramSources::operator<<(pPVar2,&local_c0);
  glu::VertexSource::~VertexSource((VertexSource *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  sVar1 = outputLayout.locationMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"frag",&local_151);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)sVar1,&local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"vtx_out_",&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"o_",&local_1e9);
  generatePassthroughFragmentShader
            (&local_1a0,shaderSpec,false,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)&outputLayout.locationSymbols.
                 super__Vector_base<const_vkt::shaderexecutor::Symbol_*,_std::allocator<const_vkt::shaderexecutor::Symbol_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1c0,&local_1e8);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_180,&local_1a0);
  glu::ProgramSources::operator<<(pPVar2,&local_180);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  FragmentOutputLayout::~FragmentOutputLayout((FragmentOutputLayout *)local_60);
  return;
}

Assistant:

void VertexShaderExecutor::generateSources (const ShaderSpec& shaderSpec, SourceCollections& programCollection)
{
	const FragmentOutputLayout	outputLayout	(computeFragmentOutputLayout(shaderSpec.outputs));

	programCollection.glslSources.add("vert") << glu::VertexSource(generateVertexShader(shaderSpec, "a_", "vtx_out_"));
	/* \todo [2015-09-11 hegedusd] set useIntOutputs parameter if needed. */
	programCollection.glslSources.add("frag") << glu::FragmentSource(generatePassthroughFragmentShader(shaderSpec, false, outputLayout.locationMap, "vtx_out_", "o_"));
}